

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBreakCommand.cxx
# Opt level: O0

bool cmBreakCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *args,cmExecutionStatus *status)

{
  MessageType MVar1;
  bool bVar2;
  PolicyStatus PVar3;
  cmMakefile *pcVar4;
  ostream *poVar5;
  PolicyID id;
  PolicyID id_00;
  string local_3c0;
  string local_3a0;
  MessageType local_37c;
  undefined1 local_378 [4];
  MessageType messageType_1;
  ostringstream e_1;
  undefined1 local_1f8 [3];
  bool issueMessage_1;
  string local_1d8;
  MessageType local_1a4;
  undefined1 local_1a0 [4];
  MessageType messageType;
  ostringstream e;
  bool issueMessage;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  pcVar4 = cmExecutionStatus::GetMakefile(status);
  bVar2 = cmMakefile::IsLoopBlock(pcVar4);
  if (!bVar2) {
    bVar2 = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    local_1a4 = AUTHOR_WARNING;
    pcVar4 = cmExecutionStatus::GetMakefile(status);
    PVar3 = cmMakefile::GetPolicyStatus(pcVar4,CMP0055,false);
    if (PVar3 == OLD) {
      bVar2 = false;
    }
    else if (PVar3 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1d8,(cmPolicies *)0x37,id);
      poVar5 = std::operator<<((ostream *)local_1a0,(string *)&local_1d8);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    else if (PVar3 - NEW < 3) {
      local_1a4 = FATAL_ERROR;
    }
    if (bVar2) {
      std::operator<<((ostream *)local_1a0,
                      "A BREAK command was found outside of a proper FOREACH or WHILE loop scope.");
      pcVar4 = cmExecutionStatus::GetMakefile(status);
      MVar1 = local_1a4;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar4,MVar1,(string *)local_1f8);
      std::__cxx11::string::~string((string *)local_1f8);
      if (local_1a4 != FATAL_ERROR) goto LAB_00530fe7;
      args_local._7_1_ = 0;
      bVar2 = true;
    }
    else {
LAB_00530fe7:
      bVar2 = false;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    if (bVar2) goto LAB_00531247;
  }
  cmExecutionStatus::SetBreakInvoked(status);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(args);
  if (!bVar2) {
    bVar2 = true;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_378);
    local_37c = AUTHOR_WARNING;
    pcVar4 = cmExecutionStatus::GetMakefile(status);
    PVar3 = cmMakefile::GetPolicyStatus(pcVar4,CMP0055,false);
    if (PVar3 == OLD) {
      bVar2 = false;
    }
    else if (PVar3 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_3a0,(cmPolicies *)0x37,id_00);
      poVar5 = std::operator<<((ostream *)local_378,(string *)&local_3a0);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string((string *)&local_3a0);
    }
    else if (PVar3 - NEW < 3) {
      local_37c = FATAL_ERROR;
    }
    if (bVar2) {
      std::operator<<((ostream *)local_378,"The BREAK command does not accept any arguments.");
      pcVar4 = cmExecutionStatus::GetMakefile(status);
      MVar1 = local_37c;
      std::__cxx11::ostringstream::str();
      cmMakefile::IssueMessage(pcVar4,MVar1,&local_3c0);
      std::__cxx11::string::~string((string *)&local_3c0);
      if (local_37c != FATAL_ERROR) goto LAB_0053120f;
      args_local._7_1_ = 0;
      bVar2 = true;
    }
    else {
LAB_0053120f:
      bVar2 = false;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_378);
    if (bVar2) goto LAB_00531247;
  }
  args_local._7_1_ = 1;
LAB_00531247:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmBreakCommand(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  if (!status.GetMakefile().IsLoopBlock()) {
    bool issueMessage = true;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0055)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0055) << "\n";
        break;
      case cmPolicies::OLD:
        issueMessage = false;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (issueMessage) {
      e << "A BREAK command was found outside of a proper "
           "FOREACH or WHILE loop scope.";
      status.GetMakefile().IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  status.SetBreakInvoked();

  if (!args.empty()) {
    bool issueMessage = true;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0055)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0055) << "\n";
        break;
      case cmPolicies::OLD:
        issueMessage = false;
        break;
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::NEW:
        messageType = MessageType::FATAL_ERROR;
        break;
    }

    if (issueMessage) {
      e << "The BREAK command does not accept any arguments.";
      status.GetMakefile().IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }

  return true;
}